

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O1

uint8_t * LPCMStreamReader::findSubstr(char *pattern,uint8_t *buff,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  bool bVar7;
  
  puVar3 = (uint8_t *)strlen(pattern);
  puVar4 = puVar3;
  if (buff < end + -(long)puVar3) {
    do {
      puVar5 = puVar4;
      if (puVar3 == (uint8_t *)0x0) {
        bVar7 = true;
      }
      else {
        bVar7 = *buff != *pattern;
        if (!bVar7) {
          puVar6 = (uint8_t *)0x1;
          do {
            puVar5 = buff;
            if (puVar3 == puVar6) break;
            puVar1 = buff + (long)puVar6;
            puVar2 = (uint8_t *)(pattern + (long)puVar6);
            bVar7 = *puVar1 != *puVar2;
            puVar5 = puVar4;
            puVar6 = puVar6 + 1;
          } while (*puVar1 == *puVar2);
        }
      }
      if (!bVar7) {
        return puVar5;
      }
      buff = buff + 1;
      puVar4 = puVar5;
    } while (buff < end + -(long)puVar3);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* LPCMStreamReader::findSubstr(const char* pattern, uint8_t* buff, const uint8_t* end)
{
    const size_t patternLen = strlen(pattern);
    for (uint8_t* curPos = buff; curPos < end - patternLen; curPos++)
    {
        for (size_t j = 0; j < patternLen; j++)
        {
            if (curPos[j] != static_cast<uint8_t>(pattern[j]))
                break;
            if (j == patternLen - 1)
                return curPos;
        }
    }
    return nullptr;
}